

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O3

void sha256_update_block(void *vctx,uint8_t *inp)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint *local_88;
  uint auStack_78 [12];
  uint32_t W [16];
  
  uVar1 = *vctx;
  uVar2 = *(uint *)((long)vctx + 4);
  uVar3 = *(uint *)((long)vctx + 8);
  uVar4 = *(uint *)((long)vctx + 0xc);
  uVar5 = *(uint *)((long)vctx + 0x10);
  uVar6 = *(uint *)((long)vctx + 0x14);
  uVar7 = *(uint *)((long)vctx + 0x18);
  uVar8 = *(uint *)((long)vctx + 0x1c);
  uVar15 = 0;
  uVar18 = uVar1;
  uVar17 = uVar2;
  uVar10 = uVar3;
  uVar14 = uVar4;
  uVar20 = uVar5;
  uVar19 = uVar6;
  uVar22 = uVar7;
  uVar12 = uVar8;
  local_88 = (uint *)inp;
  do {
    uVar21 = uVar22;
    uVar22 = uVar19;
    uVar19 = uVar20;
    uVar11 = uVar10;
    uVar10 = uVar17;
    uVar17 = uVar18;
    if (uVar15 < 0x10) {
      uVar18 = *local_88;
      uVar18 = uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 | uVar18 << 0x18;
      auStack_78[uVar15] = uVar18;
      local_88 = local_88 + 1;
    }
    else {
      uVar9 = (uint)uVar15;
      uVar18 = auStack_78[uVar9 + 0xe & 0xf];
      uVar20 = auStack_78[uVar9 + 1 & 0xf];
      uVar18 = (uVar18 >> 10 ^ (uVar18 << 0xd | uVar18 >> 0x13) ^ (uVar18 << 0xf | uVar18 >> 0x11))
               + auStack_78[uVar9 + 9 & 0xf] + auStack_78[uVar9 & 0xf] +
               (uVar20 >> 3 ^ (uVar20 << 0xe | uVar20 >> 0x12) ^ (uVar20 << 0x19 | uVar20 >> 7));
      auStack_78[uVar9 & 0xf] = uVar18;
    }
    uVar16 = uVar15 + 1;
    iVar13 = uVar12 + ((uVar22 ^ uVar21) & uVar19 ^ uVar21) +
             ((uVar19 << 7 | uVar19 >> 0x19) ^
             (uVar19 << 0x15 | uVar19 >> 0xb) ^ (uVar19 << 0x1a | uVar19 >> 6)) + uVar18 + K[uVar15]
    ;
    uVar20 = uVar14 + iVar13;
    uVar18 = (uVar11 & uVar10 ^ (uVar11 ^ uVar10) & uVar17) +
             ((uVar17 << 10 | uVar17 >> 0x16) ^
             (uVar17 << 0x13 | uVar17 >> 0xd) ^ (uVar17 << 0x1e | uVar17 >> 2)) + iVar13;
    uVar15 = uVar16;
    uVar14 = uVar11;
    uVar12 = uVar21;
  } while (uVar16 != 0x40);
  *(uint *)vctx = uVar18 + uVar1;
  *(uint *)((long)vctx + 4) = uVar17 + uVar2;
  *(uint *)((long)vctx + 8) = uVar10 + uVar3;
  *(uint *)((long)vctx + 0xc) = uVar11 + uVar4;
  *(uint *)((long)vctx + 0x10) = uVar20 + uVar5;
  *(uint *)((long)vctx + 0x14) = uVar19 + uVar6;
  *(uint *)((long)vctx + 0x18) = uVar22 + uVar7;
  *(uint *)((long)vctx + 0x1c) = uVar21 + uVar8;
  *(int *)((long)vctx + 0x60) = *(int *)((long)vctx + 0x60) + 1;
  return;
}

Assistant:

static void sha256_update_block(void *vctx, const uint8_t *inp)
{
  cf_sha256_context *ctx = vctx;

  /* This is a 16-word window into the whole W array. */
  uint32_t W[16];

  uint32_t a = ctx->H[0],
           b = ctx->H[1],
           c = ctx->H[2],
           d = ctx->H[3],
           e = ctx->H[4],
           f = ctx->H[5],
           g = ctx->H[6],
           h = ctx->H[7],
           Wt;

  for (size_t t = 0; t < 64; t++)
  {
    /* For W[0..16] we process the input into W.
     * For W[16..64] we compute the next W value:
     *
     * W[t] = SSIG1(W[t - 2]) + W[t - 7] + SSIG0(W[t - 15]) + W[t - 16];
     *
     * But all W indices are reduced mod 16 into our window.
     */
    if (t < 16)
    {
      W[t] = Wt = read32_be(inp);
      inp += 4;
    } else {
      Wt = SSIG1(W[(t - 2) % 16]) +
           W[(t - 7) % 16] +
           SSIG0(W[(t - 15) % 16]) +
           W[(t - 16) % 16];
      W[t % 16] = Wt;
    }

    uint32_t T1 = h + BSIG1(e) + CH(e, f, g) + K[t] + Wt;
    uint32_t T2 = BSIG0(a) + MAJ(a, b, c);
    h = g;
    g = f;
    f = e;
    e = d + T1;
    d = c;
    c = b;
    b = a;
    a = T1 + T2;
  }

  ctx->H[0] += a;
  ctx->H[1] += b;
  ctx->H[2] += c;
  ctx->H[3] += d;
  ctx->H[4] += e;
  ctx->H[5] += f;
  ctx->H[6] += g;
  ctx->H[7] += h;

  ctx->blocks++;
}